

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void ssl_handshake_params_init(mbedtls_ssl_handshake_params *handshake)

{
  mbedtls_ssl_handshake_params *handshake_local;
  
  memset(handshake,0,0xa98);
  mbedtls_md5_init(&handshake->fin_md5);
  mbedtls_sha1_init(&handshake->fin_sha1);
  mbedtls_md5_starts(&handshake->fin_md5);
  mbedtls_sha1_starts(&handshake->fin_sha1);
  mbedtls_sha256_init(&handshake->fin_sha256);
  mbedtls_sha256_starts(&handshake->fin_sha256,0);
  mbedtls_sha512_init(&handshake->fin_sha512);
  mbedtls_sha512_starts(&handshake->fin_sha512,1);
  handshake->update_checksum = ssl_update_checksum_start;
  handshake->sig_alg = 2;
  mbedtls_dhm_init(&handshake->dhm_ctx);
  mbedtls_ecdh_init(&handshake->ecdh_ctx);
  handshake->sni_authmode = 3;
  return;
}

Assistant:

static void ssl_handshake_params_init( mbedtls_ssl_handshake_params *handshake )
{
    memset( handshake, 0, sizeof( mbedtls_ssl_handshake_params ) );

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
     mbedtls_md5_init(   &handshake->fin_md5  );
    mbedtls_sha1_init(   &handshake->fin_sha1 );
     mbedtls_md5_starts( &handshake->fin_md5  );
    mbedtls_sha1_starts( &handshake->fin_sha1 );
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_SHA256_C)
    mbedtls_sha256_init(   &handshake->fin_sha256    );
    mbedtls_sha256_starts( &handshake->fin_sha256, 0 );
#endif
#if defined(MBEDTLS_SHA512_C)
    mbedtls_sha512_init(   &handshake->fin_sha512    );
    mbedtls_sha512_starts( &handshake->fin_sha512, 1 );
#endif
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

    handshake->update_checksum = ssl_update_checksum_start;
    handshake->sig_alg = MBEDTLS_SSL_HASH_SHA1;

#if defined(MBEDTLS_DHM_C)
    mbedtls_dhm_init( &handshake->dhm_ctx );
#endif
#if defined(MBEDTLS_ECDH_C)
    mbedtls_ecdh_init( &handshake->ecdh_ctx );
#endif
#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    mbedtls_ecjpake_init( &handshake->ecjpake_ctx );
#if defined(MBEDTLS_SSL_CLI_C)
    handshake->ecjpake_cache = NULL;
    handshake->ecjpake_cache_len = 0;
#endif
#endif

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    handshake->sni_authmode = MBEDTLS_SSL_VERIFY_UNSET;
#endif
}